

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmTargetTraceDependencies::IsUtility(cmTargetTraceDependencies *this,string *dep)

{
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmGeneratorTarget *this_00;
  char *__s;
  string tLocation;
  string depLocation;
  string util;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::GetFilenameName(&local_60,dep);
  cmsys::SystemTools::GetFilenameLastExtension(&local_a0,&local_60);
  bVar1 = std::operator==(&local_a0,".exe");
  std::__cxx11::string::~string((string *)&local_a0);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_a0,&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->GeneratorTarget->LocalGenerator,&local_60);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(dep);
    if (!bVar1) {
      bVar1 = true;
      cmTarget::AddUtility(this->GeneratorTarget->Target,&local_60,(cmMakefile *)0x0);
      goto LAB_002ff4c9;
    }
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (-1 < (int)TVar3) {
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if ((int)TVar3 < 4) {
        __s = cmGeneratorTarget::GetLocationForBuild(this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,__s,(allocator<char> *)&local_80);
        cmsys::SystemTools::GetFilenamePath(&local_80,&local_a0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        cmsys::SystemTools::GetFilenamePath(&local_80,dep);
        cmsys::SystemTools::CollapseFullPath(&local_40,&local_80);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        cmsys::SystemTools::CollapseFullPath(&local_40,&local_a0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        _Var2 = std::operator==(&local_80,&local_a0);
        if (_Var2) {
          cmTarget::AddUtility(this->GeneratorTarget->Target,&local_60,(cmMakefile *)0x0);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          bVar1 = true;
          goto LAB_002ff4c9;
        }
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  bVar1 = false;
LAB_002ff4c9:
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool cmTargetTraceDependencies::IsUtility(std::string const& dep)
{
  // Dependencies on targets (utilities) are supposed to be named by
  // just the target name.  However for compatibility we support
  // naming the output file generated by the target (assuming there is
  // no output-name property which old code would not have set).  In
  // that case the target name will be the file basename of the
  // dependency.
  std::string util = cmSystemTools::GetFilenameName(dep);
  if (cmSystemTools::GetFilenameLastExtension(util) == ".exe") {
    util = cmSystemTools::GetFilenameWithoutLastExtension(util);
  }

  // Check for a target with this name.
  if (cmGeneratorTarget* t =
        this->GeneratorTarget->GetLocalGenerator()->FindGeneratorTargetToUse(
          util)) {
    // If we find the target and the dep was given as a full path,
    // then make sure it was not a full path to something else, and
    // the fact that the name matched a target was just a coincidence.
    if (cmSystemTools::FileIsFullPath(dep)) {
      if (t->GetType() >= cmStateEnums::EXECUTABLE &&
          t->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        // This is really only for compatibility so we do not need to
        // worry about configuration names and output names.
        std::string tLocation = t->GetLocationForBuild();
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        std::string depLocation = cmSystemTools::GetFilenamePath(dep);
        depLocation = cmSystemTools::CollapseFullPath(depLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        if (depLocation == tLocation) {
          this->GeneratorTarget->Target->AddUtility(util);
          return true;
        }
      }
    } else {
      // The original name of the dependency was not a full path.  It
      // must name a target, so add the target-level dependency.
      this->GeneratorTarget->Target->AddUtility(util);
      return true;
    }
  }

  // The dependency does not name a target built in this project.
  return false;
}